

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O1

grid * __thiscall
idx2::Crop<idx2::grid,idx2::grid>(grid *__return_storage_ptr__,idx2 *this,grid *Grid1,grid *Grid2)

{
  u64 uVar1;
  long lVar2;
  u64 uVar3;
  u64 uVar4;
  u64 uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int local_48;
  
  uVar1 = *(u64 *)(this + 0x10);
  lVar2 = *(long *)this;
  lVar12 = (lVar2 << 0x2b) >> 0x2b;
  lVar8 = lVar2 * 2 >> 0x2b;
  uVar3 = (Grid1->super_extent).From;
  lVar21 = (long)(uVar3 << 0x2b) >> 0x2b;
  lVar13 = (long)(uVar3 * 2) >> 0x2b;
  if (lVar21 < lVar12) {
    lVar21 = lVar12;
  }
  iVar11 = (int)((lVar2 << 0x16) >> 0x2b);
  iVar22 = (int)((long)(uVar3 << 0x16) >> 0x2b);
  iVar20 = iVar22;
  if (iVar22 < iVar11) {
    iVar20 = iVar11;
  }
  if (lVar13 < lVar8) {
    lVar13 = lVar8;
  }
  lVar8 = *(long *)(this + 8);
  iVar14 = (int)((long)(uVar1 << 0x2b) >> 0x2b);
  iVar16 = (int)((lVar2 << 0x2b) >> 0x2b);
  iVar17 = (iVar16 - iVar14) + (((int)lVar8 << 0xb) >> 0xb) * iVar14;
  iVar24 = (int)((long)(uVar1 << 0x16) >> 0x2b);
  iVar15 = (iVar11 - iVar24) + (int)((lVar8 << 0x16) >> 0x2b) * iVar24;
  iVar23 = (int)((long)(uVar1 * 2) >> 0x2b);
  iVar6 = (int)(lVar2 * 2 >> 0x2b);
  iVar7 = (iVar6 - iVar23) + (int)(lVar8 * 2 >> 0x2b) * iVar23;
  uVar4 = (Grid1->super_extent).Dims;
  uVar5 = Grid1->Strd;
  iVar19 = (int)((long)(uVar5 << 0x2b) >> 0x2b);
  iVar19 = ((int)((long)(uVar3 << 0x2b) >> 0x2b) - iVar19) + (((int)uVar4 << 0xb) >> 0xb) * iVar19;
  iVar10 = (int)((long)(uVar5 << 0x16) >> 0x2b);
  iVar22 = (iVar22 - iVar10) + (int)((long)(uVar4 << 0x16) >> 0x2b) * iVar10;
  iVar10 = (int)((long)(uVar5 * 2) >> 0x2b);
  iVar10 = ((int)((long)(uVar3 * 2) >> 0x2b) - iVar10) + (int)((long)(uVar4 * 2) >> 0x2b) * iVar10;
  if (iVar17 <= iVar19) {
    iVar19 = iVar17;
  }
  if (iVar15 <= iVar22) {
    iVar22 = iVar15;
  }
  if (iVar7 <= iVar10) {
    iVar10 = iVar7;
  }
  local_48 = (int)lVar13;
  iVar7 = (iVar14 - iVar16) + (int)lVar21 + -1;
  iVar7 = iVar7 - iVar7 % iVar14;
  iVar17 = (iVar24 - iVar11) + iVar20 + -1;
  iVar17 = iVar17 - iVar17 % iVar24;
  iVar15 = (iVar23 - iVar6) + local_48 + -1;
  iVar15 = iVar15 - iVar15 % iVar23;
  iVar20 = (iVar19 - iVar16) - (iVar19 - iVar16) % iVar14;
  uVar3 = *(u64 *)this;
  uVar4 = *(u64 *)(this + 8);
  __return_storage_ptr__->Strd = uVar1;
  (__return_storage_ptr__->super_extent).From = uVar3;
  (__return_storage_ptr__->super_extent).Dims = uVar4;
  (__return_storage_ptr__->super_extent).From =
       (ulong)(iVar15 + iVar6 & 0x1fffff) << 0x2a |
       (ulong)(iVar17 + iVar11 & 0x1fffff) << 0x15 | (ulong)(iVar7 + iVar16 & 0x1fffff);
  uVar9 = 0;
  if ((iVar20 < iVar7) || (iVar22 = (iVar22 - iVar11) - (iVar22 - iVar11) % iVar24, iVar22 < iVar17)
     ) {
    uVar18 = 0;
  }
  else {
    iVar11 = (iVar10 - iVar6) - (iVar10 - iVar6) % iVar23;
    uVar18 = 0;
    if (iVar15 <= iVar11) {
      uVar18 = CONCAT44((iVar22 - iVar17) / iVar24 + 1,(iVar20 - iVar7) / iVar14 + 1);
      uVar9 = (ulong)((iVar11 - iVar15) / iVar23 + 1U & 0x1fffff) << 0x2a;
    }
  }
  (__return_storage_ptr__->super_extent).Dims =
       uVar18 >> 0xb & 0x3ffffe00000 | (uint)uVar18 & 0x1fffff | uVar9;
  return __return_storage_ptr__;
}

Assistant:

idx2_Inline v3i
Strd(const grid& Grid)
{
  return Unpack3i64(Grid.Strd);
}